

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.c
# Opt level: O1

xmlParserCtxtPtr
xmlCreatePushParserCtxt(xmlSAXHandlerPtr sax,void *user_data,char *chunk,int size,char *filename)

{
  xmlChar *pxVar1;
  xmlCharEncoding enc;
  xmlParserInputBufferPtr in;
  xmlParserCtxtPtr ctxt;
  char *pcVar2;
  xmlParserInputPtr pxVar3;
  xmlChar *pxVar4;
  size_t base;
  
  enc = XML_CHAR_ENCODING_NONE;
  if (3 < size && chunk != (char *)0x0) {
    enc = xmlDetectCharEncoding((uchar *)chunk,size);
  }
  in = xmlAllocParserInputBuffer(enc);
  if (in != (xmlParserInputBufferPtr)0x0) {
    ctxt = xmlNewSAXParserCtxt(sax,user_data);
    if (ctxt == (xmlParserCtxtPtr)0x0) {
      xmlErrMemory((xmlParserCtxtPtr)0x0,"creating parser: out of memory\n");
      xmlFreeParserInputBuffer(in);
      return (xmlParserCtxtPtr)0x0;
    }
    ctxt->dictNames = 1;
    if (filename == (char *)0x0) {
      pcVar2 = (char *)0x0;
    }
    else {
      pcVar2 = xmlParserGetDirectory(filename);
    }
    ctxt->directory = pcVar2;
    pxVar3 = xmlNewInputStream(ctxt);
    if (pxVar3 != (xmlParserInputPtr)0x0) {
      if (filename == (char *)0x0) {
        pxVar3->filename = (char *)0x0;
LAB_00165738:
        pxVar3->buf = in;
        xmlBufResetInput(in->buffer,pxVar3);
        inputPush(ctxt,pxVar3);
        if (chunk == (char *)0x0 || size == 0) {
          ctxt->charset = 0;
        }
        else {
          pxVar3 = ctxt->input;
          if ((pxVar3 != (xmlParserInputPtr)0x0) && (pxVar3->buf != (xmlParserInputBufferPtr)0x0)) {
            base = xmlBufGetInputBase(pxVar3->buf->buffer,pxVar3);
            pxVar3 = ctxt->input;
            pxVar4 = pxVar3->cur;
            pxVar1 = pxVar3->base;
            xmlParserInputBufferPush(pxVar3->buf,size,chunk);
            xmlBufSetInputBaseCur
                      (ctxt->input->buf->buffer,ctxt->input,base,(long)pxVar4 - (long)pxVar1);
          }
        }
        if (enc == XML_CHAR_ENCODING_NONE) {
          return ctxt;
        }
        xmlSwitchEncoding(ctxt,enc);
        return ctxt;
      }
      pxVar4 = xmlCanonicPath((xmlChar *)filename);
      pxVar3->filename = (char *)pxVar4;
      if (pxVar4 != (xmlChar *)0x0) goto LAB_00165738;
      xmlFreeInputStream(pxVar3);
    }
    xmlFreeParserCtxt(ctxt);
    xmlFreeParserInputBuffer(in);
  }
  return (xmlParserCtxtPtr)0x0;
}

Assistant:

xmlParserCtxtPtr
xmlCreatePushParserCtxt(xmlSAXHandlerPtr sax, void *user_data,
                        const char *chunk, int size, const char *filename) {
    xmlParserCtxtPtr ctxt;
    xmlParserInputPtr inputStream;
    xmlParserInputBufferPtr buf;
    xmlCharEncoding enc = XML_CHAR_ENCODING_NONE;

    /*
     * plug some encoding conversion routines
     */
    if ((chunk != NULL) && (size >= 4))
	enc = xmlDetectCharEncoding((const xmlChar *) chunk, size);

    buf = xmlAllocParserInputBuffer(enc);
    if (buf == NULL) return(NULL);

    ctxt = xmlNewSAXParserCtxt(sax, user_data);
    if (ctxt == NULL) {
        xmlErrMemory(NULL, "creating parser: out of memory\n");
	xmlFreeParserInputBuffer(buf);
	return(NULL);
    }
    ctxt->dictNames = 1;
    if (filename == NULL) {
	ctxt->directory = NULL;
    } else {
        ctxt->directory = xmlParserGetDirectory(filename);
    }

    inputStream = xmlNewInputStream(ctxt);
    if (inputStream == NULL) {
	xmlFreeParserCtxt(ctxt);
	xmlFreeParserInputBuffer(buf);
	return(NULL);
    }

    if (filename == NULL)
	inputStream->filename = NULL;
    else {
	inputStream->filename = (char *)
	    xmlCanonicPath((const xmlChar *) filename);
	if (inputStream->filename == NULL) {
            xmlFreeInputStream(inputStream);
	    xmlFreeParserCtxt(ctxt);
	    xmlFreeParserInputBuffer(buf);
	    return(NULL);
	}
    }
    inputStream->buf = buf;
    xmlBufResetInput(inputStream->buf->buffer, inputStream);
    inputPush(ctxt, inputStream);

    /*
     * If the caller didn't provide an initial 'chunk' for determining
     * the encoding, we set the context to XML_CHAR_ENCODING_NONE so
     * that it can be automatically determined later
     */
    if ((size == 0) || (chunk == NULL)) {
	ctxt->charset = XML_CHAR_ENCODING_NONE;
    } else if ((ctxt->input != NULL) && (ctxt->input->buf != NULL)) {
	size_t base = xmlBufGetInputBase(ctxt->input->buf->buffer, ctxt->input);
	size_t cur = ctxt->input->cur - ctxt->input->base;

	xmlParserInputBufferPush(ctxt->input->buf, size, chunk);

        xmlBufSetInputBaseCur(ctxt->input->buf->buffer, ctxt->input, base, cur);
#ifdef DEBUG_PUSH
	xmlGenericError(xmlGenericErrorContext, "PP: pushed %d\n", size);
#endif
    }

    if (enc != XML_CHAR_ENCODING_NONE) {
        xmlSwitchEncoding(ctxt, enc);
    }

    return(ctxt);
}